

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int read_data(spng_ctx *ctx,size_t bytes)

{
  size_t *psVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  
  if ((bytes < 0x2001) || ((*(ushort *)&ctx->field_0xcc & 1) == 0)) {
    iVar3 = (*(code *)ctx->read_fn)(ctx,ctx->stream_user_ptr,ctx->stream_buf,bytes);
    if (iVar3 == 0) {
      psVar1 = &ctx->bytes_read;
      uVar2 = *psVar1;
      *psVar1 = *psVar1 + bytes;
      iVar4 = (uint)CARRY8(uVar2,bytes) * 3;
    }
    else {
      iVar4 = -2;
      if (iVar3 == -1) {
        iVar4 = -1;
      }
    }
  }
  else {
    iVar4 = 0x50;
  }
  return iVar4;
}

Assistant:

static inline int read_data(spng_ctx *ctx, size_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;
    if(!bytes) return 0;

    if(ctx->streaming && (bytes > SPNG_READ_SIZE)) return SPNG_EINTERNAL;

    int ret = ctx->read_fn(ctx, ctx->stream_user_ptr, ctx->stream_buf, bytes);

    if(ret)
    {
        if(ret > 0 || ret < SPNG_IO_ERROR) ret = SPNG_IO_ERROR;

        return ret;
    }

    ctx->bytes_read += bytes;
    if(ctx->bytes_read < bytes) return SPNG_EOVERFLOW;

    return 0;
}